

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O2

int Assimp_Info(char **params,uint num)

{
  char cVar1;
  aiTextureType type;
  aiNode *paVar2;
  aiMesh *paVar3;
  undefined8 uVar4;
  bool bVar5;
  bool verbose;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  aiReturn aVar12;
  aiScene *scene;
  ulong uVar13;
  ulong uVar14;
  uint i;
  char *pcVar15;
  uint i_1;
  uint i_2;
  allocator<char> local_509;
  undefined8 local_508;
  uint local_4fc;
  uint local_4f8;
  uint local_4f4;
  uint local_4f0;
  uint local_4ec;
  uint local_4e8;
  uint local_4e4;
  uint local_4e0;
  uint local_4dc;
  aiVector3D special_points [3];
  ImportData import;
  string in;
  aiMemoryInfo mem;
  aiString name;
  
  pcVar15 = *params;
  cVar1 = *pcVar15;
  if (((((cVar1 != '-') || (pcVar15[1] != 'h')) || (pcVar15[2] != '\0')) &&
      (iVar6 = strcmp(pcVar15,"--help"), iVar6 != 0)) &&
     (((cVar1 != '-' || (pcVar15[1] != '?')) || (pcVar15[2] != '\0')))) {
    if (num != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&in,pcVar15,(allocator<char> *)&name);
      bVar5 = false;
      verbose = false;
      local_508 = (ulong)local_508._4_4_ << 0x20;
      for (uVar14 = 1; num != uVar14; uVar14 = uVar14 + 1) {
        pcVar15 = params[uVar14];
        iVar6 = strcmp(pcVar15,"--raw");
        if ((iVar6 == 0) || (((*pcVar15 == '-' && (pcVar15[1] == 'r')) && (pcVar15[2] == '\0')))) {
          bVar5 = true;
        }
        iVar6 = strcmp(pcVar15,"--verbose");
        if ((iVar6 == 0) || (((*pcVar15 == '-' && (pcVar15[1] == 'v')) && (pcVar15[2] == '\0')))) {
          verbose = true;
        }
        iVar6 = strcmp(pcVar15,"--silent");
        if ((iVar6 == 0) || (((*pcVar15 == '-' && (pcVar15[1] == 's')) && (pcVar15[2] == '\0')))) {
          local_508 = CONCAT44(local_508._4_4_,(int)CONCAT71((uint7)(uint3)((uint)iVar6 >> 8),1));
        }
      }
      if ((verbose) && ((local_508 & 1) != 0)) {
        printf("assimp info: Invalid arguments, verbose and silent at the same time are forbitten. "
              );
        iVar6 = 1;
      }
      else {
        import.ppFlags = 0;
        import.showLog = false;
        import.logFile._M_dataplus._M_p = (pointer)&import.logFile.field_2;
        import.logFile._M_string_length = 0;
        import.logFile.field_2._M_local_buf[0] = '\0';
        import.verbose = false;
        import.log = false;
        if ((!bVar5) && (ProcessStandardArguments(&import,params + 1,num - 1), import.ppFlags == 0))
        {
          import.ppFlags = 0x379ecb;
        }
        scene = ImportModel(&import,&in);
        if (scene == (aiScene *)0x0) {
          printf("assimp info: Unable to load input file %s\n",in._M_dataplus._M_p);
          iVar6 = 5;
        }
        else {
          mem.animations = 0;
          mem.cameras = 0;
          mem.lights = 0;
          mem.total = 0;
          mem.textures = 0;
          mem.materials = 0;
          mem.meshes = 0;
          mem.nodes = 0;
          Assimp::Importer::GetMemoryRequirements(globalImporter,&mem);
          special_points[1].y = 0.0;
          special_points[1].z = 0.0;
          special_points[2].x = 0.0;
          special_points[2].y = 0.0;
          special_points[0].x = 0.0;
          special_points[0].y = 0.0;
          special_points[0].z = 0.0;
          special_points[1].x = 0.0;
          special_points[2].z = 0.0;
          FindSpecialPoints(scene,special_points);
          uVar14 = (ulong)mem._24_8_ >> 0x20;
          paVar2 = scene->mRootNode;
          local_4dc = CountNodes(paVar2);
          local_4e0 = GetMaxDepth(paVar2);
          local_4e8 = scene->mNumMeshes;
          local_4f0 = scene->mNumMaterials;
          local_4e4 = scene->mNumAnimations;
          local_4ec = scene->mNumTextures;
          local_4f4 = scene->mNumCameras;
          local_4f8 = scene->mNumLights;
          local_4fc = CountVertices(scene);
          uVar7 = CountFaces(scene);
          uVar8 = CountBones(scene);
          uVar9 = CountAnimChannels(scene);
          FindPTypes_abi_cxx11_((string *)&name,scene);
          uVar4 = CONCAT44(name.data._0_4_,name.length);
          uVar10 = GetAvgFacePerMesh(scene);
          uVar11 = GetAvgVertsPerMesh(scene);
          printf("Memory consumption: %i B\nNodes:              %i\nMaximum depth       %i\nMeshes:             %i\nAnimations:         %i\nTextures (embed.):  %i\nMaterials:          %i\nCameras:            %i\nLights:             %i\nVertices:           %i\nFaces:              %i\nBones:              %i\nAnimation Channels: %i\nPrimitive Types:    %s\nAverage faces/mesh  %i\nAverage verts/mesh  %i\nMinimum point      (%f %f %f)\nMaximum point      (%f %f %f)\nCenter point       (%f %f %f)\n"
                 ,SUB84((double)special_points[0].x,0),(double)special_points[0].y,
                 (double)special_points[0].z,(double)special_points[1].x,(double)special_points[1].y
                 ,(double)special_points[1].z,(double)special_points[2].x,
                 (double)special_points[2].y,uVar14,(ulong)local_4dc,(ulong)local_4e0,
                 (ulong)local_4e8,(ulong)local_4e4,local_4ec,local_4f0,local_4f4,local_4f8,local_4fc
                 ,uVar7,uVar8,uVar9,uVar4,uVar10,uVar11,(double)special_points[2].z);
          std::__cxx11::string::~string((string *)&name);
          if ((local_508 & 1) == 0) {
            if (scene->mNumMeshes != 0) {
              puts("\nMeshes:  (name) [vertices / bones / faces | primitive_types]");
            }
            for (uVar14 = 0; uVar14 < scene->mNumMeshes; uVar14 = uVar14 + 1) {
              paVar3 = scene->mMeshes[uVar14];
              printf("    %d (%s)",uVar14 & 0xffffffff,(paVar3->mName).data);
              printf(": [%d / %d / %d |",(ulong)paVar3->mNumVertices,(ulong)paVar3->mNumBones);
              uVar7 = paVar3->mPrimitiveTypes;
              if ((uVar7 & 1) != 0) {
                printf(" point");
              }
              if ((uVar7 & 2) != 0) {
                printf(" line");
              }
              if ((uVar7 & 4) != 0) {
                printf(" triangle");
              }
              if ((uVar7 & 8) != 0) {
                printf(" polygon");
              }
              puts("]");
            }
            iVar6 = 0;
            for (uVar14 = 0; uVar14 < scene->mNumMaterials; uVar14 = uVar14 + 1) {
              name.length = 0;
              name.data._0_4_ = name.data._0_4_ & 0xffffff00;
              memset(name.data + 1,0x1b,0x3ff);
              aVar12 = aiGetMaterialString(scene->mMaterials[uVar14],"?mat.name",0,0,&name);
              if (aVar12 == aiReturn_SUCCESS) {
                pcVar15 = "";
                if (iVar6 == 0) {
                  pcVar15 = "\nNamed Materials:";
                }
                printf("%s\n    \'%s\'",pcVar15,name.data);
                iVar6 = iVar6 + 1;
              }
            }
            if (iVar6 != 0) {
              putchar(10);
            }
            iVar6 = 0;
            for (uVar14 = 0; uVar14 < scene->mNumMaterials; uVar14 = uVar14 + 1) {
              name.length = 0;
              name.data._0_4_ = name.data._0_4_ & 0xffffff00;
              memset(name.data + 1,0x1b,0x3ff);
              uVar13 = 0;
              while (uVar13 != 0xd) {
                type = Assimp_Info::types[uVar13];
                uVar7 = 0;
                local_508 = uVar13;
                while( true ) {
                  aVar12 = aiGetMaterialString(scene->mMaterials[uVar14],"$tex.file",type,uVar7,
                                               &name);
                  if (aVar12 != aiReturn_SUCCESS) break;
                  pcVar15 = "";
                  if (iVar6 + uVar7 == 0) {
                    pcVar15 = "\nTexture Refs:";
                  }
                  printf("%s\n    \'%s\'",pcVar15,name.data);
                  uVar7 = uVar7 + 1;
                }
                iVar6 = iVar6 + uVar7;
                uVar13 = local_508 + 1;
              }
            }
            if (iVar6 != 0) {
              putchar(10);
            }
            iVar6 = 0;
            for (uVar14 = 0; uVar14 < scene->mNumAnimations; uVar14 = uVar14 + 1) {
              if ((scene->mAnimations[uVar14]->mName).length != 0) {
                pcVar15 = "";
                if (iVar6 == 0) {
                  pcVar15 = "\nNamed Animations:";
                }
                printf("%s\n     \'%s\'",pcVar15,(scene->mAnimations[uVar14]->mName).data);
                iVar6 = iVar6 + 1;
              }
            }
            if (iVar6 != 0) {
              putchar(10);
            }
            puts("\nNode hierarchy:");
            paVar2 = scene->mRootNode;
            std::__cxx11::string::string<std::allocator<char>>((string *)&name,"",&local_509);
            PrintHierarchy(paVar2,(string *)&name,verbose,false,true);
            std::__cxx11::string::~string((string *)&name);
          }
          putchar(10);
          iVar6 = 0;
        }
        std::__cxx11::string::~string((string *)&import.logFile);
      }
      std::__cxx11::string::~string((string *)&in);
      return iVar6;
    }
    puts("assimp info: Invalid number of arguments. See \'assimp info --help\'");
    return 1;
  }
  printf("%s",AICMD_MSG_INFO_HELP_E);
  return 0;
}

Assistant:

int Assimp_Info (const char* const* params, unsigned int num) {
	// --help
	if (!strcmp( params[0],"-h")||!strcmp( params[0],"--help")||!strcmp( params[0],"-?") ) {
		printf("%s",AICMD_MSG_INFO_HELP_E);
		return 0;
	}

	// asssimp info <file> [-r]
	if (num < 1) {
		printf("assimp info: Invalid number of arguments. "
			"See \'assimp info --help\'\n");
		return 1;
	}

	const std::string in  = std::string(params[0]);

	// get -r and -v arguments
	bool raw = false;
	bool verbose = false;
	bool silent = false;
	for(unsigned int i = 1; i < num; ++i) {
		if (!strcmp(params[i],"--raw")||!strcmp(params[i],"-r")) {
			raw = true;
		}
		if (!strcmp(params[i],"--verbose")||!strcmp(params[i],"-v")) {
			verbose = true;
		}
		if (!strcmp(params[i], "--silent") || !strcmp(params[i], "-s")) {
			silent = true;
		}
	}

	// Verbose and silent at the same time are not allowed
	if ( verbose && silent ) {
		printf("assimp info: Invalid arguments, verbose and silent at the same time are forbitten. ");
		return 1;
	}
	
	// Parse post-processing flags unless -r was specified
	ImportData import;
	if (!raw) {
		// get import flags
		ProcessStandardArguments(import, params + 1, num - 1);

		//No custom post process flags defined, we set all the post process flags active
		if(import.ppFlags == 0)
			import.ppFlags |= aiProcessPreset_TargetRealtime_MaxQuality;
	}

	// import the main model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		printf("assimp info: Unable to load input file %s\n",
			in.c_str());
		return 5;
	}

	aiMemoryInfo mem;
	globalImporter->GetMemoryRequirements(mem);


	static const char* format_string =
		"Memory consumption: %i B\n"
		"Nodes:              %i\n"
		"Maximum depth       %i\n"
		"Meshes:             %i\n"
		"Animations:         %i\n"
		"Textures (embed.):  %i\n"
		"Materials:          %i\n"
		"Cameras:            %i\n"
		"Lights:             %i\n"
		"Vertices:           %i\n"
		"Faces:              %i\n"
		"Bones:              %i\n"
		"Animation Channels: %i\n"
		"Primitive Types:    %s\n"
		"Average faces/mesh  %i\n"
		"Average verts/mesh  %i\n"
		"Minimum point      (%f %f %f)\n"
		"Maximum point      (%f %f %f)\n"
		"Center point       (%f %f %f)\n"

		;

	aiVector3D special_points[3];
	FindSpecialPoints(scene,special_points);
	printf(format_string,
		mem.total,
		CountNodes(scene->mRootNode),
		GetMaxDepth(scene->mRootNode),
		scene->mNumMeshes,
		scene->mNumAnimations,
		scene->mNumTextures,
		scene->mNumMaterials,
		scene->mNumCameras,
		scene->mNumLights,
		CountVertices(scene),
		CountFaces(scene),
		CountBones(scene),
		CountAnimChannels(scene),
		FindPTypes(scene).c_str(),
		GetAvgFacePerMesh(scene),
		GetAvgVertsPerMesh(scene),
		special_points[0][0],special_points[0][1],special_points[0][2],
		special_points[1][0],special_points[1][1],special_points[1][2],
		special_points[2][0],special_points[2][1],special_points[2][2]
		)
	;

	if (silent)
	{
		printf("\n");
		return 0;
	}

	// meshes
	if (scene->mNumMeshes) {
		printf("\nMeshes:  (name) [vertices / bones / faces | primitive_types]\n");
	}
	for (unsigned int i = 0; i < scene->mNumMeshes; ++i) {
		const aiMesh* mesh = scene->mMeshes[i];
		printf("    %d (%s)", i, mesh->mName.C_Str());
		printf(
			": [%d / %d / %d |",
			mesh->mNumVertices,
			mesh->mNumBones,
			mesh->mNumFaces
		);
		const unsigned int ptypes = mesh->mPrimitiveTypes;
		if (ptypes & aiPrimitiveType_POINT) { printf(" point"); }
		if (ptypes & aiPrimitiveType_LINE) { printf(" line"); }
		if (ptypes & aiPrimitiveType_TRIANGLE) { printf(" triangle"); }
		if (ptypes & aiPrimitiveType_POLYGON) { printf(" polygon"); }
		printf("]\n");
	}

	// materials
	unsigned int total=0;
	for(unsigned int i = 0;i < scene->mNumMaterials; ++i) {
		aiString name;
		if (AI_SUCCESS==aiGetMaterialString(scene->mMaterials[i],AI_MATKEY_NAME,&name)) {
			printf("%s\n    \'%s\'",(total++?"":"\nNamed Materials:" ),name.data);
		}
	}
	if(total) {
		printf("\n");
	}

	// textures
	total=0;
	for(unsigned int i = 0;i < scene->mNumMaterials; ++i) {
		aiString name;
		static const aiTextureType types[] = {
			aiTextureType_NONE,
			aiTextureType_DIFFUSE,
			aiTextureType_SPECULAR,
			aiTextureType_AMBIENT,
			aiTextureType_EMISSIVE,
			aiTextureType_HEIGHT,
			aiTextureType_NORMALS,
			aiTextureType_SHININESS,
			aiTextureType_OPACITY,
			aiTextureType_DISPLACEMENT,
			aiTextureType_LIGHTMAP,
			aiTextureType_REFLECTION,
			aiTextureType_UNKNOWN
		};
		for(unsigned int type = 0; type < sizeof(types)/sizeof(types[0]); ++type) {
			for(unsigned int idx = 0;AI_SUCCESS==aiGetMaterialString(scene->mMaterials[i],
				AI_MATKEY_TEXTURE(types[type],idx),&name); ++idx) {
				printf("%s\n    \'%s\'",(total++?"":"\nTexture Refs:" ),name.data);
			}
		}
	}
	if(total) {
		printf("\n");
	}

	// animations
	total=0;
	for(unsigned int i = 0;i < scene->mNumAnimations; ++i) {
		if (scene->mAnimations[i]->mName.length) {
			printf("%s\n     \'%s\'",(total++?"":"\nNamed Animations:" ),scene->mAnimations[i]->mName.data);
		}
	}
	if(total) {
		printf("\n");
	}

	// node hierarchy
	printf("\nNode hierarchy:\n");
	PrintHierarchy(scene->mRootNode,"",verbose);

	printf("\n");
	return 0;
}